

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O2

spv_result_t
spvExtInstTableValueLookup
          (spv_ext_inst_table table,spv_ext_inst_type_t type,uint32_t value,
          spv_ext_inst_desc *pEntry)

{
  spv_ext_inst_group_t *psVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if (table == (spv_ext_inst_table)0x0) {
    return SPV_ERROR_INVALID_TABLE;
  }
  if (pEntry != (spv_ext_inst_desc *)0x0) {
    uVar4 = 0;
    do {
      if (uVar4 == table->count) {
        return SPV_ERROR_INVALID_LOOKUP;
      }
      psVar1 = table->groups;
      if (psVar1[uVar4].type == type) {
        lVar2 = -0xb8;
        while (lVar3 = lVar2, (ulong)psVar1[uVar4].count * 0xb8 - (lVar3 + 0xb8) != 0) {
          lVar2 = lVar3 + 0xb8;
          if (*(uint32_t *)((long)psVar1[uVar4].entries[1].operandTypes + lVar3 + -0x10) == value) {
            *pEntry = (spv_ext_inst_desc)
                      ((long)psVar1[uVar4].entries[1].operandTypes + lVar3 + -0x18);
            return SPV_SUCCESS;
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while( true );
  }
  return SPV_ERROR_INVALID_POINTER;
}

Assistant:

spv_result_t spvExtInstTableValueLookup(const spv_ext_inst_table table,
                                        const spv_ext_inst_type_t type,
                                        const uint32_t value,
                                        spv_ext_inst_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  for (uint32_t groupIndex = 0; groupIndex < table->count; groupIndex++) {
    const auto& group = table->groups[groupIndex];
    if (type != group.type) continue;
    for (uint32_t index = 0; index < group.count; index++) {
      const auto& entry = group.entries[index];
      if (value == entry.ext_inst) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}